

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void kj::Directory::commitFailed(WriteMode mode)

{
  bool bVar1;
  Fault local_40;
  Fault f_3;
  Fault f_2;
  Fault f_1;
  Fault local_18;
  Fault f;
  WriteMode mode_local;
  
  f.exception._4_4_ = mode;
  bVar1 = has<kj::WriteMode,void>(mode,CREATE);
  if ((!bVar1) || (bVar1 = has<kj::WriteMode,void>(f.exception._4_4_,MODIFY), bVar1)) {
    bVar1 = has<kj::WriteMode,void>(f.exception._4_4_,MODIFY);
    if ((!bVar1) || (bVar1 = has<kj::WriteMode,void>(f.exception._4_4_,CREATE), bVar1)) {
      bVar1 = has<kj::WriteMode,void>(f.exception._4_4_,MODIFY);
      if ((bVar1) || (bVar1 = has<kj::WriteMode,void>(f.exception._4_4_,CREATE), bVar1)) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                  (&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x301,FAILED,(char *)0x0,
                   "\"tryCommit() returned null despite no preconditions\"",
                   (char (*) [51])"tryCommit() returned null despite no preconditions");
        kj::_::Debug::Fault::~Fault(&local_40);
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58]>
                  (&f_3,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x2ff,FAILED,(char *)0x0,
                   "\"neither WriteMode::CREATE nor WriteMode::MODIFY was given\"",
                   (char (*) [58])"neither WriteMode::CREATE nor WriteMode::MODIFY was given");
        kj::_::Debug::Fault::~Fault(&f_3);
      }
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[30]>
                (&f_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x2fd,FAILED,(char *)0x0,"\"replace target does not exist\"",
                 (char (*) [30])"replace target does not exist");
      kj::_::Debug::Fault::~Fault(&f_2);
    }
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[30]>
              (&local_18,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x2fb,FAILED,(char *)0x0,"\"replace target already exists\"",
               (char (*) [30])"replace target already exists");
    kj::_::Debug::Fault::~Fault(&local_18);
  }
  return;
}

Assistant:

void Directory::commitFailed(WriteMode mode) {
  if (has(mode, WriteMode::CREATE) && !has(mode, WriteMode::MODIFY)) {
    KJ_FAIL_REQUIRE("replace target already exists") { break; }
  } else if (has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_REQUIRE("replace target does not exist") { break; }
  } else if (!has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_ASSERT("neither WriteMode::CREATE nor WriteMode::MODIFY was given") { break; }
  } else {
    KJ_FAIL_ASSERT("tryCommit() returned null despite no preconditions") { break; }
  }
}